

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O2

TRef fold_bufstr_kfold_cse(jit_State *J)

{
  IROp1 IVar1;
  ushort uVar2;
  ushort uVar3;
  IRRef1 IVar4;
  IRIns *pIVar5;
  TRef TVar6;
  ulong uVar7;
  IRRef1 *pIVar8;
  IRIns *pIVar9;
  IRIns *pIVar10;
  
  if ((J->flags >> 0x10 & 1) != 0) {
    IVar1 = (J->fold).left[0].field_1.o;
    if (IVar1 == 'T') {
      pIVar10 = (J->cur).ir;
      uVar7 = (ulong)(J->fold).left[0].field_0.op1;
      if ((*(char *)((long)pIVar10 + uVar7 * 8 + 5) == 'S') &&
         ((*(byte *)((long)pIVar10 + uVar7 * 8 + 2) & 1) == 0)) {
        uVar2 = (J->fold).left[0].field_0.op2;
LAB_00143e4b:
        return (uint)uVar2;
      }
    }
    else if (IVar1 == 'S') {
      if (((ulong)(J->fold).left[0] & 0x10000) == 0) {
        TVar6 = lj_ir_kgc(J,(GCobj *)(J[-1].penalty + 0x3a),IRT_STR);
        return TVar6;
      }
      IVar4 = (J->fold).left[0].field_0.prev;
      (J->fold).ins.field_0.op1 = (J->fold).left[0].field_0.op1;
      (J->fold).ins.field_0.op2 = IVar4;
      TVar6 = lj_opt_cse(J);
      return TVar6;
    }
  }
  if ((J->flags >> 0x11 & 1) != 0) {
    pIVar8 = J->chain + 0x55;
    while( true ) {
      uVar2 = *pIVar8;
      if ((ulong)uVar2 == 0) break;
      pIVar5 = (J->cur).ir;
      pIVar9 = (J->fold).left;
      pIVar10 = pIVar5 + uVar2;
      while( true ) {
        IVar1 = (pIVar9->field_1).o;
        if (IVar1 != *(IROp1 *)((long)pIVar5 + (ulong)(pIVar10->field_0).op1 * 8 + 5)) break;
        pIVar10 = pIVar5 + (pIVar10->field_0).op1;
        uVar3 = (pIVar9->field_0).op2;
        if (uVar3 != (pIVar10->field_0).op2) break;
        if (IVar1 == 'S' && (uVar3 & 1) == 0) goto LAB_00143e4b;
        if (IVar1 == '_' && uVar3 == 0x17) break;
        pIVar9 = pIVar5 + (pIVar9->field_0).op1;
      }
      pIVar8 = &pIVar5[uVar2].field_0.prev;
    }
  }
  TVar6 = lj_ir_emit(J);
  return TVar6;
}

Assistant:

LJFOLD(BUFSTR any any)
LJFOLDF(bufstr_kfold_cse)
{
  lj_assertJ(fleft->o == IR_BUFHDR || fleft->o == IR_BUFPUT ||
	     fleft->o == IR_CALLL,
	     "bad buffer constructor IR op %d", fleft->o);
  if (LJ_LIKELY(J->flags & JIT_F_OPT_FOLD)) {
    if (fleft->o == IR_BUFHDR) {  /* No put operations? */
      if (!(fleft->op2 & IRBUFHDR_APPEND))  /* Empty buffer? */
	return lj_ir_kstr(J, &J2G(J)->strempty);
      fins->op1 = fleft->op1;
      fins->op2 = fleft->prev;  /* Relies on checks in bufput_append. */
      return CSEFOLD;
    } else if (fleft->o == IR_BUFPUT) {
      IRIns *irb = IR(fleft->op1);
      if (irb->o == IR_BUFHDR && !(irb->op2 & IRBUFHDR_APPEND))
	return fleft->op2;  /* Shortcut for a single put operation. */
    }
  }
  /* Try to CSE the whole chain. */
  if (LJ_LIKELY(J->flags & JIT_F_OPT_CSE)) {
    IRRef ref = J->chain[IR_BUFSTR];
    while (ref) {
      IRIns *irs = IR(ref), *ira = fleft, *irb = IR(irs->op1);
      while (ira->o == irb->o && ira->op2 == irb->op2) {
	lj_assertJ(ira->o == IR_BUFHDR || ira->o == IR_BUFPUT ||
		   ira->o == IR_CALLL || ira->o == IR_CARG,
		   "bad buffer constructor IR op %d", ira->o);
	if (ira->o == IR_BUFHDR && !(ira->op2 & IRBUFHDR_APPEND))
	  return ref;  /* CSE succeeded. */
	if (ira->o == IR_CALLL && ira->op2 == IRCALL_lj_buf_puttab)
	  break;
	ira = IR(ira->op1);
	irb = IR(irb->op1);
      }
      ref = irs->prev;
    }
  }
  return EMITFOLD;  /* No CSE possible. */
}